

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::addPoolNinjaVariable
          (cmNinjaTargetGenerator *this,string *pool_property,cmGeneratorTarget *target,
          cmNinjaVars *vars)

{
  char *pcVar1;
  mapped_type *pmVar2;
  allocator local_39;
  key_type local_38;
  
  pcVar1 = cmGeneratorTarget::GetProperty(target,pool_property);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"pool",&local_39);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_38);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::addPoolNinjaVariable(
                                              const std::string& pool_property,
                                              cmGeneratorTarget* target,
                                              cmNinjaVars& vars)
{
    const char* pool = target->GetProperty(pool_property);
    if (pool)
      {
      vars["pool"] = pool;
      }
}